

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromAigPhase(Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  int local_44;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObj;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pMan_local;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x256,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pMan->nBarBufs;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar5 = Aig_ManConst1(pMan);
  (pAVar5->field_5).pData = pAVar4;
  local_44 = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(pMan);
    iVar2 = Aig_ManRegNum(pMan);
    if (iVar1 - iVar2 <= local_44) break;
    pvVar6 = Vec_PtrEntry(pMan->vCis,local_44);
    pAVar4 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(pMan);
    iVar2 = Aig_ManRegNum(pMan);
    if (iVar1 - iVar2 <= local_44) break;
    pvVar6 = Vec_PtrEntry(pMan->vCos,local_44);
    pAVar4 = Abc_NtkCreatePo(pNtk);
    *(Abc_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    local_44 = local_44 + 1;
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Aig_ManCiNum(pMan);
  iVar3 = Aig_ManRegNum(pMan);
  if (iVar1 != iVar2 - iVar3) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x26d,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  iVar2 = Aig_ManCoNum(pMan);
  iVar3 = Aig_ManRegNum(pMan);
  if (iVar1 != iVar2 - iVar3) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x26e,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  for (local_44 = 0; iVar1 = Aig_ManRegNum(pMan), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar5 = Aig_ManLi(pMan,local_44);
    pAVar7 = Aig_ManLo(pMan,local_44);
    pAVar4 = Abc_NtkCreateLatch(pNtk);
    pAVar8 = Abc_NtkCreateBi(pNtk);
    (pAVar5->field_5).pData = pAVar8;
    pAVar8 = Abc_NtkCreateBo(pNtk);
    (pAVar7->field_5).pData = pAVar8;
    Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)(pAVar5->field_5).pData);
    Abc_ObjAddFanin((Abc_Obj_t *)(pAVar7->field_5).pData,pAVar4);
    Abc_LatchSetInit0(pAVar4);
  }
  p = Aig_ManDfs(pMan,1);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,local_44);
    iVar1 = Aig_ObjIsBuf(pAVar5);
    if (iVar1 == 0) {
      pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar5);
      pAVar8 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar5);
      pAVar4 = Abc_AigAnd(pMan_00,pAVar4,pAVar8);
      (pAVar5->field_5).pData = pAVar4;
    }
    else {
      pAVar7 = Aig_ObjChild0Copy(pAVar5);
      (pAVar5->field_5).pData = pAVar7;
    }
  }
  Vec_PtrFree(p);
  for (local_44 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_44);
    pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar5);
    pAVar8 = Abc_NtkCo(pNtk,local_44);
    Abc_ObjAddFanin(pAVar8,pAVar4);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  Abc_NtkAddDummyBoxNames(pNtk);
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    Abc_Print(1,"Abc_NtkFromAigPhase(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromAigPhase( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName((Abc_Obj_t *)pObjLi->pData), NULL );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName((Abc_Obj_t *)pObjLo->pData), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }

    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromAigPhase(): Network check has failed.\n" );
    return pNtkNew;
}